

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SingleCharFinder.hpp
# Opt level: O2

void __thiscall
peach::fsm::SingleCharFinder::SingleCharFinder
          (SingleCharFinder *this,
          vector<std::pair<char,_unsigned_long>,_std::allocator<std::pair<char,_unsigned_long>_>_>
          *chars)

{
  pointer ppVar1;
  pointer ppVar2;
  shared_ptr<peach::fsm::Node> charNode;
  __shared_ptr<peach::fsm::Node,_(__gnu_cxx::_Lock_policy)2> local_60;
  Node local_50;
  
  FiniteStateMachine::FiniteStateMachine(&this->super_FiniteStateMachine);
  ppVar1 = (chars->
           super__Vector_base<std::pair<char,_unsigned_long>,_std::allocator<std::pair<char,_unsigned_long>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  for (ppVar2 = (chars->
                super__Vector_base<std::pair<char,_unsigned_long>,_std::allocator<std::pair<char,_unsigned_long>_>_>
                )._M_impl.super__Vector_impl_data._M_start; ppVar2 != ppVar1; ppVar2 = ppVar2 + 1) {
    std::__shared_ptr<peach::fsm::Node,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_60,(__shared_ptr<peach::fsm::Node,_(__gnu_cxx::_Lock_policy)2> *)this);
    Node::addTransitionToNewNode<peach::transition::SingleCharTransition,char_const&>
              (&local_50,(tokenCategory_t)local_60._M_ptr,(char *)0x0);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_60._M_refcount);
    Node::addTransitionToNewNode<peach::transition::TrueTransition>
              ((Node *)&local_50.transitions_.
                        super__Vector_base<std::pair<std::unique_ptr<peach::transition::CharTransition,_std::default_delete<peach::transition::CharTransition>_>,_std::shared_ptr<peach::fsm::Node>_>,_std::allocator<std::pair<std::unique_ptr<peach::transition::CharTransition,_std::default_delete<peach::transition::CharTransition>_>,_std::shared_ptr<peach::fsm::Node>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage,
               (tokenCategory_t)
               local_50.transitions_.
               super__Vector_base<std::pair<std::unique_ptr<peach::transition::CharTransition,_std::default_delete<peach::transition::CharTransition>_>,_std::shared_ptr<peach::fsm::Node>_>,_std::allocator<std::pair<std::unique_ptr<peach::transition::CharTransition,_std::default_delete<peach::transition::CharTransition>_>,_std::shared_ptr<peach::fsm::Node>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_50.category_);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
               &local_50.transitions_.
                super__Vector_base<std::pair<std::unique_ptr<peach::transition::CharTransition,_std::default_delete<peach::transition::CharTransition>_>,_std::shared_ptr<peach::fsm::Node>_>,_std::allocator<std::pair<std::unique_ptr<peach::transition::CharTransition,_std::default_delete<peach::transition::CharTransition>_>,_std::shared_ptr<peach::fsm::Node>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish);
  }
  return;
}

Assistant:

SingleCharFinder(const std::vector<std::pair<char, token::tokenCategory_t>> &chars)
    {
        for (const auto &[ch, category] : chars)
        {
            auto charNode = getRoot()->addTransitionToNewNode<transition::SingleCharTransition>(token::tokenCategory::UNDEFINED, ch);
            charNode->addTransitionToNewNode<transition::TrueTransition>(category);
        }
    }